

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O0

void __thiscall KokkosTools::ChromeTracing::State::end_frame(State *this)

{
  bool bVar1;
  reference this_00;
  State *this_local;
  
  bVar1 = std::
          vector<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
          ::empty(&this->current_stack);
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,
                    "Attempting to end root stack frame before Kokkos::finalize()\n");
  }
  else {
    if ((this->first & 1U) == 0) {
      std::operator<<((ostream *)this,",\n");
    }
    this->first = false;
    this_00 = std::
              vector<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
              ::back(&this->current_stack);
    StackNode::print(this_00,(ostream *)this);
    std::
    vector<KokkosTools::ChromeTracing::StackNode,_std::allocator<KokkosTools::ChromeTracing::StackNode>_>
    ::pop_back(&this->current_stack);
  }
  return;
}

Assistant:

void end_frame() {
    if (current_stack.empty()) {
      std::cerr
          << "Attempting to end root stack frame before Kokkos::finalize()\n";
      return;
    }

    if (!first) outfile << ",\n";
    first = false;

    current_stack.back().print(outfile);
    current_stack.pop_back();
  }